

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QDBusArgument qvariant_cast<QDBusArgument>(QVariant *v)

{
  PrivateShared *pPVar1;
  bool bVar2;
  QMetaType QVar3;
  long *in_RSI;
  PrivateShared *pPVar4;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(in_RSI[3] & 0xfffffffffffffffc);
  bVar2 = comparesEqual(&local_28,&local_20);
  if (bVar2) {
    pPVar1 = (PrivateShared *)*in_RSI;
    if ((*(byte *)(in_RSI + 3) & 1) == 0) {
      (v->d).data.shared = pPVar1;
      *in_RSI = 0;
    }
    else {
      pPVar4 = pPVar1 + *(int *)(pPVar1 + 4);
      if (*(int *)pPVar1 == 1) {
        (v->d).data.shared = (PrivateShared *)*(QDBusArgumentPrivate **)&pPVar4->field_0x0;
        *(QDBusArgumentPrivate **)&pPVar4->field_0x0 = (QDBusArgumentPrivate *)0x0;
      }
      else {
        QDBusArgument::QDBusArgument((QDBusArgument *)v,(QDBusArgument *)pPVar4);
      }
    }
  }
  else {
    (v->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QDBusArgument::QDBusArgument((QDBusArgument *)v);
    QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if ((*(byte *)(in_RSI + 3) & 1) != 0) {
      in_RSI = (long *)((long)*(int *)(*in_RSI + 4) + *in_RSI);
    }
    QMetaType::convert(QVar3,in_RSI,local_20,v);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QDBusArgument)(QDBusArgumentPrivate *)v;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}